

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost89_set_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  uchar *in_RAX;
  int *piVar2;
  GOST_CIPHER_PARAMS *a;
  uchar *puVar3;
  ASN1_OBJECT *pAVar4;
  ASN1_OCTET_STRING *pAVar5;
  uchar *local_38;
  
  local_38 = in_RAX;
  piVar2 = (int *)EVP_CIPHER_CTX_get_cipher_data();
  a = GOST_CIPHER_PARAMS_new();
  if (a == (GOST_CIPHER_PARAMS *)0x0) {
    iVar1 = 0x562;
  }
  else {
    pAVar5 = (ASN1_OCTET_STRING *)a->iv;
    puVar3 = (uchar *)EVP_CIPHER_CTX_iv(ctx);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    iVar1 = ASN1_OCTET_STRING_set(pAVar5,puVar3,iVar1);
    if (iVar1 == 0) {
      GOST_CIPHER_PARAMS_free(a);
      iVar1 = 0x568;
    }
    else {
      ASN1_OBJECT_free((ASN1_OBJECT *)a->enc_param_set);
      pAVar4 = OBJ_nid2obj(*piVar2);
      a->enc_param_set = (ASN1_OBJECT *)pAVar4;
      iVar1 = i2d_GOST_CIPHER_PARAMS(a,(uchar **)0x0);
      puVar3 = (uchar *)CRYPTO_malloc(iVar1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                                      ,0x56f);
      local_38 = puVar3;
      if (puVar3 == (uchar *)0x0) {
        GOST_CIPHER_PARAMS_free(a);
        ERR_GOST_error(0x69,0xc0100,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                       ,0x572);
        return 0;
      }
      i2d_GOST_CIPHER_PARAMS(a,&local_38);
      GOST_CIPHER_PARAMS_free(a);
      pAVar5 = ASN1_OCTET_STRING_new();
      if ((pAVar5 != (ASN1_OCTET_STRING *)0x0) &&
         (iVar1 = ASN1_OCTET_STRING_set(pAVar5,puVar3,iVar1), iVar1 != 0)) {
        CRYPTO_free(puVar3);
        ASN1_TYPE_set((ASN1_TYPE *)params,0x10,pAVar5);
        return 1;
      }
      CRYPTO_free(puVar3);
      iVar1 = 0x57c;
    }
  }
  ERR_GOST_error(0x69,0xc0100,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                 ,iVar1);
  return 0;
}

Assistant:

static int gost89_set_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    int len = 0;
    unsigned char *buf = NULL;
    unsigned char *p = NULL;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    GOST_CIPHER_PARAMS *gcp = GOST_CIPHER_PARAMS_new();
    ASN1_OCTET_STRING *os = NULL;
    if (!gcp) {
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    if (!ASN1_OCTET_STRING_set
        (gcp->iv, EVP_CIPHER_CTX_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx))) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    ASN1_OBJECT_free(gcp->enc_param_set);
    gcp->enc_param_set = OBJ_nid2obj(c->paramNID);

    len = i2d_GOST_CIPHER_PARAMS(gcp, NULL);
    p = buf = OPENSSL_malloc(len);
    if (!buf) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    i2d_GOST_CIPHER_PARAMS(gcp, &p);
    GOST_CIPHER_PARAMS_free(gcp);

    os = ASN1_OCTET_STRING_new();

    if (!os || !ASN1_OCTET_STRING_set(os, buf, len)) {
        OPENSSL_free(buf);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    OPENSSL_free(buf);

    ASN1_TYPE_set(params, V_ASN1_SEQUENCE, os);
    return 1;
}